

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

void Cba_ObjSetAttrs(Cba_Ntk_t *p,int i,int *a,int s)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  iVar1 = Cba_ObjAttr(p,i);
  if (iVar1 == 0) {
    if (a != (int *)0x0) {
      Vec_IntSetEntry(&p->vObjAttr,i,(p->vAttrSto).nSize);
      Vec_IntPush(&p->vAttrSto,s);
      uVar3 = 0;
      uVar2 = (ulong)(uint)s;
      if (s < 1) {
        uVar2 = uVar3;
      }
      for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        Vec_IntPush(&p->vAttrSto,a[uVar3]);
      }
    }
    return;
  }
  __assert_fail("Cba_ObjAttr(p, i) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                ,0xfa,"void Cba_ObjSetAttrs(Cba_Ntk_t *, int, int *, int)");
}

Assistant:

static inline void           Cba_ObjSetAttrs( Cba_Ntk_t * p, int i, int * a, int s )  { assert(Cba_ObjAttr(p, i) == 0); if ( !a ) return; Vec_IntSetEntry(&p->vObjAttr, i, Vec_IntSize(&p->vAttrSto)); Vec_IntPush(&p->vAttrSto, s); Vec_IntPushArray(&p->vAttrSto, a, s);  }